

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O3

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createUnaryOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  UnaryExpression *this_00;
  
  if (SUB < op) {
    if (op != NOT) {
      return (INode *)0x0;
    }
    op = MUL;
  }
  this_00 = (UnaryExpression *)operator_new(0x18);
  MathML::AST::UnaryExpression::UnaryExpression(this_00);
  (*(this_00->super_INode)._vptr_INode[6])(this_00,(ulong)op);
  (*(this_00->super_INode)._vptr_INode[10])
            (this_00,*(nodes->
                      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                      )._M_impl.super__Vector_impl_data._M_start);
  return &this_00->super_INode;
}

Assistant:

MathML::AST::INode* FormulasLoader::createUnaryOperation( const NodeVector& nodes, Operator op )
	{
		MathML::AST::UnaryExpression::Operator mmlOp;
		switch ( op )
		{
		case ADD:
			mmlOp = MathML::AST::UnaryExpression::ADD;
			break;
		case SUB:
			mmlOp = MathML::AST::UnaryExpression::SUB;
			break;
		case NOT:
			mmlOp = MathML::AST::UnaryExpression::NOT;
			break;
		default:
			// invalid operator
			return 0;
		}

		MathML::AST::UnaryExpression* expression = new MathML::AST::UnaryExpression();
		expression->setOperator( mmlOp );
		expression->setOperand( nodes[ 0 ] );

		return expression;
	}